

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  _Rb_tree_node_base *p_Var1;
  Option *pOVar2;
  pointer pcVar3;
  pointer puVar4;
  pointer pbVar5;
  Option *this_00;
  pointer ppVar6;
  App *pAVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  bool bVar9;
  INIError *__return_storage_ptr__;
  char *__s;
  size_t sVar10;
  _Rb_tree_node_base *p_Var11;
  pointer ppVar12;
  RequiresError *this_01;
  ExcludesError *this_02;
  long *plVar13;
  ArgumentMismatch *__return_storage_ptr___00;
  RequiredError *pRVar14;
  CallForHelp *this_03;
  ExtrasError *this_04;
  size_type *psVar15;
  long lVar16;
  pointer puVar17;
  Option_p *opt;
  pointer pbVar18;
  pointer pbVar19;
  bool positional_only;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  bool local_1a1;
  undefined1 local_1a0 [32];
  App *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_178;
  pointer local_170;
  value_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->parsed_ = true;
  local_1a1 = false;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      _parse_single(this,args,&local_1a1);
    } while ((args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pOVar2 = this->help_ptr_;
  if ((pOVar2 != (Option *)0x0) &&
     ((pOVar2->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pOVar2->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_03 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForHelp::CallForHelp(this_03);
    __cxa_throw(this_03,&CallForHelp::typeinfo,Error::~Error);
  }
  pOVar2 = this->config_ptr_;
  local_180 = this;
  local_178 = args;
  if (pOVar2 != (Option *)0x0) {
    if ((pOVar2->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pOVar2->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      Option::run_callback(pOVar2);
      this->config_required_ = true;
    }
    if ((this->config_name_)._M_string_length != 0) {
      detail::parse_ini((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                        local_1a0,&this->config_name_);
      while (local_1a0._0_8_ != local_1a0._8_8_) {
        bVar9 = _parse_ini(this,(vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                                 *)local_1a0);
        if (!bVar9) {
          __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          pcVar3 = (((pointer)(local_1a0._8_8_ + -0x40))->fullname)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar3,
                     pcVar3 + (((pointer)(local_1a0._8_8_ + -0x40))->fullname)._M_string_length);
          INIError::Extras(__return_storage_ptr__,&local_f0);
          __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,Error::~Error);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                 local_1a0);
    }
  }
  puVar17 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != puVar4) {
    do {
      pOVar2 = (puVar17->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((*(pointer *)
            ((long)&(pOVar2->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8) == *(pointer *)
                     &(pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl) && ((pOVar2->envname_)._M_string_length != 0)) {
        local_1a0._8_8_ = (pointer)0x0;
        local_1a0[0x10] = '\0';
        local_1a0._0_8_ = (pointer)(local_1a0 + 0x10);
        __s = getenv((((puVar17->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->envname_).
                     _M_dataplus._M_p);
        if (__s != (char *)0x0) {
          local_148._M_allocated_capacity = (size_type)&local_138;
          sVar10 = strlen(__s);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,__s,__s + sVar10);
          ::std::__cxx11::string::operator=((string *)local_1a0,(string *)local_148._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_allocated_capacity != &local_138) {
            operator_delete((void *)local_148._M_allocated_capacity);
          }
        }
        if ((pointer)local_1a0._8_8_ != (pointer)0x0) {
          pOVar2 = (puVar17->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_1a0._0_8_,
                     (pointer)(local_1a0._0_8_ + (long)(string *)local_1a0._8_8_));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pOVar2->results_,&local_168);
          pOVar2->callback_run_ = false;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
        }
        if ((pointer)local_1a0._0_8_ != (pointer)(local_1a0 + 0x10)) {
          operator_delete((void *)local_1a0._0_8_);
        }
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar4);
  }
  pAVar7 = local_180;
  puVar4 = (local_180->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar17 = (local_180->options_).
                 super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar4; puVar17 = puVar17 + 1
      ) {
    pOVar2 = (puVar17->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((*(pointer *)
          ((long)&(pOVar2->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          + 8) != (pOVar2->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) && (pOVar2->callback_run_ == false)) {
      Option::run_callback(pOVar2);
    }
  }
  puVar17 = (pAVar7->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_170 = (pAVar7->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_170) {
    do {
      pOVar2 = (puVar17->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      bVar9 = (pOVar2->super_OptionBase<CLI::Option>).required_;
      if ((bVar9 != false) ||
         (*(pointer *)
           ((long)&(pOVar2->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8) != *(pointer *)
                    &(pOVar2->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl)) {
        if ((pOVar2->expected_ < 0) &&
           ((ulong)((long)*(pointer *)
                           ((long)&(pOVar2->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 8) -
                    *(long *)&(pOVar2->results_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl >> 5) < (ulong)(uint)-pOVar2->expected_)) {
          __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    (&local_50,
                     (puVar17->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::AtLeast
                    (__return_storage_ptr___00,&local_50,
                     -((puVar17->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->expected_);
          __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        if ((bVar9 != false) &&
           (*(pointer *)
             ((long)&(pOVar2->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8) == *(pointer *)
                      &(pOVar2->results_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl)) {
          pRVar14 = (RequiredError *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    ((string *)local_1a0,
                     (puVar17->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          plVar13 = (long *)::std::__cxx11::string::append(local_1a0);
          local_128._M_dataplus._M_p = (pointer)*plVar13;
          psVar15 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_128._M_dataplus._M_p == psVar15) {
            local_128.field_2._M_allocated_capacity = *psVar15;
            local_128.field_2._8_8_ = plVar13[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar15;
          }
          local_128._M_string_length = plVar13[1];
          *plVar13 = (long)psVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          RequiredError::RequiredError(pRVar14,&local_128);
          __cxa_throw(pRVar14,&RequiredError::typeinfo,Error::~Error);
        }
      }
      p_Var11 = *(_Base_ptr *)((long)&(pOVar2->requires_)._M_t + 0x18);
      p_Var1 = (_Rb_tree_node_base *)((long)&(pOVar2->requires_)._M_t + 8);
      if (p_Var11 != p_Var1) {
        pbVar18 = *(pointer *)
                   &(pOVar2->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl;
        pbVar5 = *(pointer *)
                  ((long)&(pOVar2->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
        do {
          if ((pbVar5 != pbVar18) &&
             (this_00 = *(Option **)(p_Var11 + 1),
             (this_00->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (this_00->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)) {
            this_01 = (RequiresError *)__cxa_allocate_exception(0x38);
            Option::single_name_abi_cxx11_
                      (&local_70,
                       (puVar17->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            Option::single_name_abi_cxx11_(&local_90,this_00);
            RequiresError::RequiresError(this_01,&local_70,&local_90);
            __cxa_throw(this_01,&RequiresError::typeinfo,Error::~Error);
          }
          p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != p_Var1);
      }
      p_Var11 = *(_Base_ptr *)((long)&(pOVar2->excludes_)._M_t + 0x18);
      p_Var1 = (_Rb_tree_node_base *)((long)&(pOVar2->excludes_)._M_t + 8);
      if (p_Var11 != p_Var1) {
        pbVar18 = *(pointer *)
                   &(pOVar2->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl;
        pbVar5 = *(pointer *)
                  ((long)&(pOVar2->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
        do {
          if ((pbVar5 != pbVar18) &&
             (pOVar2 = *(Option **)(p_Var11 + 1),
             (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)) {
            this_02 = (ExcludesError *)__cxa_allocate_exception(0x38);
            Option::single_name_abi_cxx11_
                      (&local_b0,
                       (puVar17->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            Option::single_name_abi_cxx11_(&local_d0,pOVar2);
            ExcludesError::ExcludesError(this_02,&local_b0,&local_d0);
            __cxa_throw(this_02,&ExcludesError::typeinfo,Error::~Error);
          }
          p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != p_Var1);
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != local_170);
  }
  pAVar7 = local_180;
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_1a0,
             &local_180->parsed_subcommands_);
  if ((ulong)((long)(local_1a0._8_8_ - local_1a0._0_8_) >> 3) < pAVar7->require_subcommand_min_) {
    pRVar14 = (RequiredError *)__cxa_allocate_exception(0x38);
    RequiredError::Subcommand(pRVar14,pAVar7->require_subcommand_min_);
    __cxa_throw(pRVar14,&RequiredError::typeinfo,Error::~Error);
  }
  if ((pAVar7->allow_extras_ == false) && (pAVar7->prefix_command_ == false)) {
    ppVar12 = (pAVar7->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (pAVar7->missing_).
             super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar12 != ppVar6) {
      lVar16 = 0;
      do {
        lVar16 = lVar16 + (ulong)(ppVar12->first != POSITIONAL_MARK);
        ppVar12 = ppVar12 + 1;
      } while (ppVar12 != ppVar6);
      if (lVar16 != 0) {
        remaining_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_148,pAVar7,false);
        pvVar8 = local_178;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(local_178,&local_148);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_148);
        pbVar18 = (pvVar8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar19 = pbVar5 + -1;
        if (pbVar18 < pbVar19 && pbVar18 != pbVar5) {
          do {
            ::std::__cxx11::string::swap((string *)pbVar18);
            pbVar18 = pbVar18 + 1;
            pbVar19 = pbVar19 + -1;
          } while (pbVar18 < pbVar19);
        }
        this_04 = (ExtrasError *)__cxa_allocate_exception(0x38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_108,local_178);
        ExtrasError::ExtrasError(this_04,&local_108);
        __cxa_throw(this_04,&ExtrasError::typeinfo,Error::~Error);
      }
    }
  }
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_);
  }
  return;
}

Assistant:

void _parse(std::vector<std::string> &args) {
        parsed_ = true;
        bool positional_only = false;

        while(!args.empty()) {
            _parse_single(args, positional_only);
        }

        if(help_ptr_ != nullptr && help_ptr_->count() > 0) {
            throw CallForHelp();
        }

        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<detail::ini_ret_t> values = detail::parse_ini(config_name_);
                    while(!values.empty()) {
                        if(!_parse_ini(values)) {
                            throw INIError::Extras(values.back().fullname);
                        }
                    }
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }

        // Get envname options if not yet passed
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        // Process callbacks
        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        // Verify required options
        for(const Option_p &opt : options_) {
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_expected()))
                    throw ArgumentMismatch::AtLeast(opt->single_name(), -opt->get_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->single_name() + " is required");
            }
            // Requires
            for(const Option *opt_req : opt->requires_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->single_name(), opt_req->single_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->single_name(), opt_ex->single_name());
        }

        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);

        // Convert missing (pairs) to extras (string only)
        if(!(allow_extras_ || prefix_command_)) {
            size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                args = remaining(false);
                std::reverse(std::begin(args), std::end(args));
                throw ExtrasError(args);
            }
        }
    }